

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O3

void test_2d_dynamic<5ul,1ul,1ul,1ul,30ul,30ul>(void)

{
  int ****ppppiVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  int *****pppppiVar4;
  int *****pppppiVar5;
  ulong uVar6;
  int *****pppppiVar7;
  long lVar8;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int ****local_a8;
  int ****local_a0;
  int ****local_98;
  int ****local_90;
  vector<int,_std::allocator<int>_> local_88;
  ulong local_70;
  pointer local_68;
  pointer local_60;
  long local_58;
  pointer local_50;
  long local_48;
  int ****local_40;
  long local_38;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_90 = (int ****)CONCAT71(local_90._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_88,(bool *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_90._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(int *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1f;
  local_90 = (int ****)CONCAT44(local_90._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(int *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  local_90 = (int ****)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003c1;
  local_90 = (int ****)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_90 = (int ****)CONCAT71(local_90._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_88,(bool *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5;
  local_90 = (int ****)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1f;
  local_90 = (int ****)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xb4;
  local_90 = (int ****)0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_000003c1;
  local_90 = (int ****)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_88,(unsigned_long *)&local_90);
  local_90 = (int ****)CONCAT44(local_90._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,0x3c1,(value_type_conflict1 *)&local_90,(allocator_type *)&local_a8);
  uVar6 = 0;
  local_68 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_98 = (int ****)0x0;
  local_a0 = (int ****)0x0;
  do {
    lVar8 = 0;
    local_70 = uVar6;
    while( true ) {
      pppppiVar5 = (int *****)((long)local_98 + lVar8);
      local_a8 = (int ****)pppppiVar5;
      local_90 = (int ****)pppppiVar5;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_a8,(unsigned_long *)&local_90);
      ppppiVar1 = (int ****)((long)local_68 + uVar6);
      local_60 = local_68 + (long)local_90;
      local_a8 = ppppiVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_a8,&local_60);
      if (lVar8 == 0x1e) break;
      if ((int *****)local_a0 == (int *****)0x1e) {
        *(int *)ppppiVar1 = 0x18;
        local_a8._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe5,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)&local_a8);
        if ((int *****)
            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= pppppiVar5) goto LAB_0010a59f;
        local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xe8,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + uVar6),(int *)&local_a8);
      }
      lVar8 = lVar8 + 1;
      uVar6 = uVar6 + 4;
    }
    *(undefined4 *)((long)local_68 + uVar6) = 0x11;
    local_a8._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0xda,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)ppppiVar1,(int *)&local_a8);
    if ((int *****)
        ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) <= pppppiVar5) goto LAB_0010a59f;
    local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0xdd,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar6),(int *)&local_a8);
    local_a0 = (int ****)((long)local_a0 + 1);
    local_98 = (int ****)((long)local_98 + 0x1f);
    uVar6 = local_70 + 0x7c;
  } while ((int *****)local_a0 != (int *****)0x1f);
  uVar6 = 0;
  local_a0 = (int ****)0x0;
  local_50 = (pointer)0x0;
  do {
    pppppiVar5 = (int *****)0x0;
    local_70 = uVar6;
    do {
      local_a8 = (int ****)((long)local_a0 + (long)pppppiVar5);
      pppppiVar7 = &local_a8;
      local_98 = local_a8;
      local_90 = local_a8;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)pppppiVar7,(unsigned_long *)&local_90);
      ppppiVar1 = (int ****)((long)local_68 + uVar6);
      local_60 = local_68 + (long)local_90;
      local_a8 = ppppiVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)pppppiVar7,&local_60);
      *(int *)ppppiVar1 = 0x47;
      local_a8._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)ppppiVar1,(int *)pppppiVar7);
      if ((int *****)
          ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) <= local_98) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_0010a58e;
      }
      local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar6),(int *)&local_a8);
      pppppiVar5 = (int *****)((long)pppppiVar5 + 5);
      uVar6 = uVar6 + 0x14;
    } while (pppppiVar5 != (int *****)0x1e);
    local_50 = (pointer)((long)local_50 + 1);
    local_a0 = (int ****)((long)local_a0 + 0x1f);
    uVar6 = local_70 + 0x7c;
  } while (local_50 != (pointer)0x1e);
  local_58 = 0;
  local_50 = local_68;
  lVar8 = 0;
  pppppiVar7 = (int *****)0x0;
  local_48 = 0;
  while( true ) {
    local_98 = (int ****)0x0;
    uVar6 = 0;
    local_40 = (int ****)pppppiVar7;
    local_38 = lVar8;
    while( true ) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      local_a8 = (int ****)pppppiVar7;
      local_a0 = (int ****)pppppiVar7;
      local_90 = (int ****)pppppiVar7;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_a8,(unsigned_long *)&local_90);
      pppppiVar5 = (int *****)local_98;
      ppppiVar1 = (int ****)((long)local_50 + (long)local_98);
      local_60 = local_68 + (long)local_90;
      local_a8 = ppppiVar1;
      local_70 = uVar6;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_a8,&local_60);
      if (pppppiVar5 == (int *****)0x78) break;
      if (local_48 == 0x1e) {
        local_a8._0_4_ = 0x18;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x116,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)&local_a8);
        pppppiVar4 = (int *****)local_98;
        pppppiVar7 = (int *****)local_a0;
        if ((int *****)
            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= local_a0) goto LAB_0010a58e;
        local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x119,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((undefined1 *)
                            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + local_58) + (long)local_98),
                   (int *)&local_a8);
      }
      else if ((byte)((SUB161(auVar2 * ZEXT816(0xcccccccccccccccd),8) & 0xfc) * '\x05') ==
               (char)pppppiVar5) {
        local_a8._0_4_ = 0x47;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x124,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)&local_a8);
        pppppiVar4 = (int *****)local_98;
        pppppiVar7 = (int *****)local_a0;
        if ((int *****)
            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= local_a0) goto LAB_0010a58e;
        local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x47);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","71",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x127,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((undefined1 *)
                            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + local_58) + (long)local_98),
                   (int *)&local_a8);
      }
      else {
        local_a8._0_4_ = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,300,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)ppppiVar1,(int *)&local_a8);
        pppppiVar4 = (int *****)local_98;
        pppppiVar7 = (int *****)local_a0;
        if ((int *****)
            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) <= local_a0) goto LAB_0010a58e;
        local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x2a);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x12f,
                   "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)((undefined1 *)
                            ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + local_58) + (long)local_98),
                   (int *)&local_a8);
      }
      uVar6 = local_70 + 1;
      local_98 = (int ****)((long)pppppiVar4 + 4);
      pppppiVar7 = (int *****)((long)pppppiVar7 + 1);
    }
    local_a8._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x10d,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)ppppiVar1,(int *)&local_a8);
    lVar8 = local_38;
    pppppiVar7 = (int *****)local_a0;
    if ((int *****)
        ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) <= local_a0) break;
    local_a8 = (int ****)CONCAT44(local_a8._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i, j)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x110,
               "void test_2d_dynamic() [StepX = 5UL, StepY = 1UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)(((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start - local_38) + (long)local_98),
               (int *)&local_a8);
    local_48 = local_48 + 1;
    pppppiVar7 = (int *****)((long)local_40 + 0x1f);
    lVar8 = lVar8 + -0x7c;
    local_50 = local_50 + 0x1f;
    local_58 = local_58 + 0x7c;
    if (local_48 == 0x1f) {
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_0010a58e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pppppiVar7)
  ;
LAB_0010a59f:
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pppppiVar5);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}